

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O1

unsigned_long genRandLong(MTRand *rand)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (0x26f < (uint)rand->index) {
    if (rand->index != 0x270) {
      rand->mt[0] = 0x1105;
      lVar3 = 1;
      uVar4 = 0x1105;
      do {
        uVar4 = (ulong)(uint)((int)uVar4 * 0x17b5);
        rand->mt[lVar3] = uVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x270);
      rand->index = 0x270;
    }
    lVar3 = 0;
    do {
      uVar1 = (uint)rand->mt[lVar3 + 1];
      rand->mt[lVar3] =
           genRandLong::mag[uVar1 & 1] ^ rand->mt[lVar3 + 0x18d] ^
           (ulong)((uVar1 & 0x7ffffffe | (uint)rand->mt[lVar3] & 0x80000000) >> 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe3);
    lVar3 = 0xe4;
    do {
      uVar1 = (uint)rand->mt[lVar3];
      rand->mt[lVar3 + -1] =
           genRandLong::mag[uVar1 & 1] ^ *(ulong *)((long)rand + lVar3 * 8 + -0x720) ^
           (ulong)((uVar1 & 0x7ffffffe | (uint)rand->mt[lVar3 + -1] & 0x80000000) >> 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    uVar1 = (uint)rand->mt[0];
    rand->mt[0x26f] =
         genRandLong::mag[uVar1 & 1] ^ rand->mt[0x18c] ^
         (ulong)((uVar1 & 0x7ffffffe | (uint)rand->mt[0x26f] & 0x80000000) >> 1);
    rand->index = 0;
  }
  iVar2 = rand->index;
  rand->index = iVar2 + 1;
  uVar4 = rand->mt[iVar2] >> 0xb ^ rand->mt[iVar2];
  uVar4 = ((uint)uVar4 & 0x13a58ad) << 7 ^ uVar4;
  uVar4 = ((uint)uVar4 & 0x1df8c) << 0xf ^ uVar4;
  return uVar4 >> 0x12 ^ uVar4;
}

Assistant:

unsigned long genRandLong(MTRand *rand) {

    unsigned long y;
    static unsigned long mag[2] = {0x0, 0x9908b0df}; /* mag[x] = x * 0x9908b0df for x = 0,1 */
    if (rand->index >= STATE_VECTOR_LENGTH || rand->index < 0) {
        /* generate STATE_VECTOR_LENGTH words at a time */
        int kk;
        if (rand->index >= STATE_VECTOR_LENGTH + 1 || rand->index < 0) {
            m_seedRand(rand, 4357);
        }
        for (kk = 0; kk < STATE_VECTOR_LENGTH - STATE_VECTOR_M; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + STATE_VECTOR_M] ^ (y >> 1) ^ mag[y & 0x1];
        }
        for (; kk < STATE_VECTOR_LENGTH - 1; kk++) {
            y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk + 1] & LOWER_MASK);
            rand->mt[kk] = rand->mt[kk + (STATE_VECTOR_M - STATE_VECTOR_LENGTH)] ^ (y >> 1) ^ mag[y & 0x1];
        }
        y = (rand->mt[STATE_VECTOR_LENGTH - 1] & UPPER_MASK) | (rand->mt[0] & LOWER_MASK);
        rand->mt[STATE_VECTOR_LENGTH - 1] = rand->mt[STATE_VECTOR_M - 1] ^ (y >> 1) ^ mag[y & 0x1];
        rand->index = 0;
    }
    y = rand->mt[rand->index++];
    y ^= (y >> 11);
    y ^= (y << 7) & TEMPERING_MASK_B;
    y ^= (y << 15) & TEMPERING_MASK_C;
    y ^= (y >> 18);
    return y;
}